

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O0

void __thiscall
llvm::SmallPtrSetImplBase::CopyFrom(SmallPtrSetImplBase *this,SmallPtrSetImplBase *RHS)

{
  bool bVar1;
  void **ppvVar2;
  void **T;
  SmallPtrSetImplBase *RHS_local;
  SmallPtrSetImplBase *this_local;
  
  if (RHS == this) {
    __assert_fail("&RHS != this && \"Self-copy should be handled by the caller.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0x92,"void llvm::SmallPtrSetImplBase::CopyFrom(const SmallPtrSetImplBase &)");
  }
  bVar1 = isSmall(this);
  if (((bVar1) && (bVar1 = isSmall(RHS), bVar1)) && (this->CurArraySize != RHS->CurArraySize)) {
    __assert_fail("CurArraySize == RHS.CurArraySize && \"Cannot assign sets with different small sizes\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0x96,"void llvm::SmallPtrSetImplBase::CopyFrom(const SmallPtrSetImplBase &)");
  }
  bVar1 = isSmall(RHS);
  if (bVar1) {
    bVar1 = isSmall(this);
    if (!bVar1) {
      free(this->CurArray);
    }
    this->CurArray = this->SmallArray;
  }
  else if (this->CurArraySize != RHS->CurArraySize) {
    bVar1 = isSmall(this);
    if (bVar1) {
      ppvVar2 = (void **)safe_malloc((ulong)RHS->CurArraySize << 3);
      this->CurArray = ppvVar2;
    }
    else {
      ppvVar2 = (void **)safe_realloc(this->CurArray,(ulong)RHS->CurArraySize << 3);
      this->CurArray = ppvVar2;
    }
  }
  CopyHelper(this,RHS);
  return;
}

Assistant:

void SmallPtrSetImplBase::CopyFrom(const SmallPtrSetImplBase &RHS) {
  assert(&RHS != this && "Self-copy should be handled by the caller.");

  if (isSmall() && RHS.isSmall())
    assert(CurArraySize == RHS.CurArraySize &&
           "Cannot assign sets with different small sizes");

  // If we're becoming small, prepare to insert into our stack space
  if (RHS.isSmall()) {
    if (!isSmall())
      free(CurArray);
    CurArray = SmallArray;
  // Otherwise, allocate new heap space (unless we were the same size)
  } else if (CurArraySize != RHS.CurArraySize) {
    if (isSmall())
      CurArray = (const void**)safe_malloc(sizeof(void*) * RHS.CurArraySize);
    else {
      const void **T = (const void**)safe_realloc(CurArray,
                                             sizeof(void*) * RHS.CurArraySize);
      CurArray = T;
    }
  }

  CopyHelper(RHS);
}